

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

double * cardinal_cos(int j,int m,int n,double *t)

{
  undefined1 auVar1 [16];
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  double *pdVar8;
  double tj;
  double r8_pi;
  double r8_eps;
  double dStack_30;
  int i;
  double cj;
  double *c;
  double *t_local;
  int n_local;
  int m_local;
  int j_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar7);
  if (j % (m + 1) == 0) {
    dStack_30 = 2.0;
  }
  else {
    dStack_30 = 1.0;
  }
  __x = ((double)j * 3.141592653589793) / (double)(m + 1);
  for (r8_eps._4_4_ = 0; r8_eps._4_4_ < n; r8_eps._4_4_ = r8_eps._4_4_ + 1) {
    if (2.220446049250313e-16 < ABS(t[r8_eps._4_4_] - __x)) {
      dVar2 = r8_mop(j + 1);
      dVar3 = sin(t[r8_eps._4_4_]);
      dVar4 = sin((double)(m + 1) * t[r8_eps._4_4_]);
      dVar5 = cos(t[r8_eps._4_4_]);
      dVar6 = cos(__x);
      pdVar8[r8_eps._4_4_] =
           (((dVar2 * dVar3 * dVar4) / dStack_30) / (double)(m + 1)) / (dVar5 - dVar6);
    }
    else {
      pdVar8[r8_eps._4_4_] = 1.0;
    }
  }
  return pdVar8;
}

Assistant:

BURKHARDT_EXPORT
double *cardinal_cos ( int j, int m, int n, double t[] )

//****************************************************************************80
//
//  Purpose:
//
//    CARDINAL_COS evaluates the J-th cardinal cosine basis function.
//
//  Discussion:
//
//    The base points are T(I) = pi * I / ( M + 1 ), 0 <= I <= M + 1.
//    Basis function J is 1 at T(J), and 0 at T(I) for I /= J
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    13 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    John Boyd,
//    Exponentially convergent Fourier-Chebyshev quadrature schemes on
//    bounded and infinite intervals,
//    Journal of Scientific Computing,
//    Volume 2, Number 2, 1987, pages 99-109.
//
//  Parameters:
//
//    Input, int J, the index of the basis function.
//    0 <= J <= M + 1.
//
//    Input, int M, indicates the size of the basis set.
//
//    Input, int N, the number of sample points.
//
//    Input, double T[N], one or more points in [0,pi] where the
//    basis function is to be evaluated.
//
//    Output, double CARDINAL_COS[N], the value of the function at T.
//
{
  double *c;
  double cj;
  int i;
  const double r8_eps = 2.220446049250313E-016;
  const double r8_pi = 3.141592653589793;
  double tj;

  c = new double[n];

  if ( ( j % ( m + 1 ) ) == 0 )
  {
    cj = 2.0;
  }
  else
  {
    cj = 1.0;
  }

  tj = r8_pi * double( j ) / double( m + 1 );

  for ( i = 0; i < n; i++ )
  {
    if ( fabs ( t[i] - tj ) <= r8_eps )
    {
      c[i] = 1.0;
    }
    else
    {
      c[i] = r8_mop ( j + 1 ) 
        * sin ( t[i] ) 
        * sin ( double( m + 1 ) * t[i] ) 
        / cj 
        / double( m + 1 ) 
        / ( cos ( t[i] ) - cos ( tj ) );
    }
  }

  return c;
}